

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness
          (DescriptorBuilder *this,EnumDescriptorProto *proto,EnumDescriptor *result)

{
  EnumValueDescriptor *pEVar1;
  char *pcVar2;
  undefined8 *puVar3;
  size_t __n;
  string *element_name;
  char cVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  long *plVar8;
  mapped_type *ppEVar9;
  Type *pTVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong i;
  long lVar14;
  long lVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_bool>
  pVar16;
  string error_message;
  string stripped;
  PrefixRemover remover;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  values;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>
  local_148;
  StringPiece local_120;
  long local_110;
  long lStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 *local_e0;
  ulong local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  EnumDescriptorProto *local_c0;
  DescriptorBuilder *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  EnumDescriptor *local_90;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  local_60;
  
  pcVar2 = (char *)**(undefined8 **)result;
  sVar7 = (*(undefined8 **)result)[1];
  local_c0 = proto;
  local_b8 = this;
  if ((long)sVar7 < 0) {
    StringPiece::LogFatalSizeTooBig(sVar7,"size_t to int conversion");
  }
  local_e0 = &local_d0;
  local_d8 = 0;
  local_d0 = 0;
  local_60._M_impl._0_8_ = pcVar2;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ = sVar7;
  if (0 < (long)sVar7) {
    lVar14 = 0;
    do {
      cVar4 = StringPiece::operator[]((StringPiece *)&local_60,lVar14);
      if (cVar4 != '_') {
        StringPiece::operator[]((StringPiece *)&local_60,lVar14);
        std::__cxx11::string::push_back((char)&local_e0);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (long)local_60._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_60._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(result + 0x2c)) {
    local_c0 = (EnumDescriptorProto *)&local_c0->value_;
    lVar14 = 0;
    local_90 = result;
    do {
      local_88 = *(long *)(result + 0x30);
      puVar3 = *(undefined8 **)(local_88 + lVar14 * 0x28);
      plVar8 = (long *)*puVar3;
      sVar7 = puVar3[1];
      if ((long)sVar7 < 0) {
        StringPiece::LogFatalSizeTooBig(sVar7,"size_t to int conversion");
      }
      local_120.ptr_ = (char *)plVar8;
      local_120.length_ = sVar7;
      if (sVar7 == 0) {
        i = 0;
        uVar13 = 0;
      }
      else {
        i = 0;
        uVar13 = 0;
        if (local_d8 != 0) {
          uVar13 = 0;
          i = 0;
          do {
            cVar4 = StringPiece::operator[](&local_120,i);
            if (cVar4 != '_') {
              cVar5 = StringPiece::operator[](&local_120,i);
              cVar4 = cVar5 + ' ';
              if (0x19 < (byte)(cVar5 + 0xbfU)) {
                cVar4 = cVar5;
              }
              if (cVar4 != local_e0[uVar13]) {
                plVar8 = (long *)local_120.ptr_;
                sVar7 = local_120.length_;
                if ((long *)local_120.ptr_ == (long *)0x0) goto LAB_002e7c7d;
                goto LAB_002e7c67;
              }
              uVar13 = uVar13 + 1;
            }
            i = i + 1;
          } while ((i < (ulong)local_120.length_) && (uVar13 < local_d8));
        }
      }
      if (uVar13 < local_d8) {
LAB_002e7c0f:
        plVar8 = (long *)local_120.ptr_;
        sVar7 = local_120.length_;
        if ((long *)local_120.ptr_ != (long *)0x0) {
LAB_002e7c67:
          lVar15 = (long)local_120.ptr_ + local_120.length_;
          goto LAB_002e7c6a;
        }
LAB_002e7c7d:
        local_120.length_ = sVar7;
        local_120.ptr_ = (char *)plVar8;
        local_148.first._M_dataplus._M_p = (pointer)&local_148.first.field_2;
        local_148.first._M_string_length = 0;
        local_148.first.field_2._M_allocated_capacity =
             local_148.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        while ((i < (ulong)local_120.length_ &&
               (cVar4 = StringPiece::operator[](&local_120,i), cVar4 == '_'))) {
          i = i + 1;
        }
        sVar7 = local_120.length_ - i;
        if (sVar7 == 0) goto LAB_002e7c0f;
        if (local_120.length_ < (long)i) {
          __assert_fail("length_ >= n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                        ,0x119,
                        "void google::protobuf::StringPiece::remove_prefix(stringpiece_ssize_type)")
          ;
        }
        plVar8 = (long *)((long)local_120.ptr_ + i);
        if ((long *)local_120.ptr_ == (long *)0x0) goto LAB_002e7c7d;
        lVar15 = (long)local_120.ptr_ + local_120.length_;
        local_120.ptr_ = (char *)((long)local_120.ptr_ + i);
        local_120.length_ = sVar7;
LAB_002e7c6a:
        local_148.first._M_dataplus._M_p = (pointer)&local_148.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,local_120.ptr_,lVar15);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)&local_100);
      if (local_148.first._M_string_length != 0) {
        uVar13 = 0;
        do {
          if (local_148.first._M_dataplus._M_p[uVar13] != '_') {
            std::__cxx11::string::push_back('\0');
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < local_148.first._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
        operator_delete(local_148.first._M_dataplus._M_p,
                        local_148.first.field_2._M_allocated_capacity + 1);
      }
      local_148.first._M_dataplus._M_p = (pointer)&local_148.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_100._M_dataplus._M_p,
                 local_100._M_dataplus._M_p + local_100._M_string_length);
      pEVar1 = (EnumValueDescriptor *)(local_88 + lVar14 * 0x28);
      local_148.second = pEVar1;
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
               ::
               _M_emplace_unique<std::pair<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
                           *)&local_60,&local_148);
      result = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
        operator_delete(local_148.first._M_dataplus._M_p,
                        local_148.first.field_2._M_allocated_capacity + 1);
      }
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        plVar8 = *(long **)(pVar16.first._M_node._M_node + 2);
        puVar3 = (undefined8 *)*plVar8;
        __n = puVar3[1];
        if (((__n != (*(undefined8 **)pEVar1)[1]) ||
            ((__n != 0 &&
             (iVar6 = bcmp((void *)*puVar3,(void *)**(undefined8 **)pEVar1,__n), iVar6 != 0)))) &&
           ((int)plVar8[2] != *(int *)(pEVar1 + 0x10))) {
          std::operator+(&local_80,"When enum name is stripped and label is PascalCased (",
                         &local_100);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar11 = plVar8 + 2;
          if ((long *)*plVar8 == plVar11) {
            local_a0 = *plVar11;
            lStack_98 = plVar8[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar11;
            local_b0 = (long *)*plVar8;
          }
          local_a8 = plVar8[1];
          *plVar8 = (long)plVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ppEVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                  *)&local_60,&local_100);
          plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,**(ulong **)*ppEVar9);
          local_120.ptr_ = (char *)&local_110;
          plVar11 = plVar8 + 2;
          if ((long *)*plVar8 == plVar11) {
            local_110 = *plVar11;
            lStack_108 = plVar8[3];
          }
          else {
            local_110 = *plVar11;
            local_120.ptr_ = (char *)*plVar8;
          }
          local_120.length_ = plVar8[1];
          *plVar8 = (long)plVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
          local_148.first._M_dataplus._M_p = (pointer)&local_148.first.field_2;
          puVar12 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_148.first.field_2._M_allocated_capacity = *puVar12;
            local_148.first.field_2._8_8_ = plVar8[3];
          }
          else {
            local_148.first.field_2._M_allocated_capacity = *puVar12;
            local_148.first._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_148.first._M_string_length = plVar8[1];
          *plVar8 = (long)puVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((long *)local_120.ptr_ != &local_110) {
            operator_delete(local_120.ptr_,local_110 + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          element_name = *(string **)(pEVar1 + 8);
          if (*(int *)(*(long *)(result + 0x10) + 0x8c) == 2) {
            pTVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                                ((RepeatedPtrFieldBase *)local_c0,(int)lVar14);
            AddWarning(local_b8,element_name,&pTVar10->super_Message,NAME,&local_148.first);
          }
          else {
            pTVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                                ((RepeatedPtrFieldBase *)local_c0,(int)lVar14);
            AddError(local_b8,element_name,&pTVar10->super_Message,NAME,&local_148.first);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148.first._M_dataplus._M_p != &local_148.first.field_2) {
            operator_delete(local_148.first._M_dataplus._M_p,
                            local_148.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < *(int *)(result + 0x2c));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckEnumValueUniqueness(
    const EnumDescriptorProto& proto, const EnumDescriptor* result) {

  // Check that enum labels are still unique when we remove the enum prefix from
  // values that have it.
  //
  // This will fail for something like:
  //
  //   enum MyEnum {
  //     MY_ENUM_FOO = 0;
  //     FOO = 1;
  //   }
  //
  // By enforcing this reasonable constraint, we allow code generators to strip
  // the prefix and/or PascalCase it without creating conflicts.  This can lead
  // to much nicer language-specific enums like:
  //
  //   enum NameType {
  //     FirstName = 1,
  //     LastName = 2,
  //   }
  //
  // Instead of:
  //
  //   enum NameType {
  //     NAME_TYPE_FIRST_NAME = 1,
  //     NAME_TYPE_LAST_NAME = 2,
  //   }
  PrefixRemover remover(result->name());
  std::map<string, const google::protobuf::EnumValueDescriptor*> values;
  for (int i = 0; i < result->value_count(); i++) {
    const google::protobuf::EnumValueDescriptor* value = result->value(i);
    string stripped =
        EnumValueToPascalCase(remover.MaybeRemove(value->name()));
    std::pair<std::map<string, const google::protobuf::EnumValueDescriptor*>::iterator,
              bool>
        insert_result = values.insert(std::make_pair(stripped, value));
    bool inserted = insert_result.second;

    // We don't throw the error if the two conflicting symbols are identical, or
    // if they map to the same number.  In the former case, the normal symbol
    // duplication error will fire so we don't need to (and its error message
    // will make more sense). We allow the latter case so users can create
    // aliases which add or remove the prefix (code generators that do prefix
    // stripping should de-dup the labels in this case).
    if (!inserted && insert_result.first->second->name() != value->name() &&
        insert_result.first->second->number() != value->number()) {
      string error_message =
          "When enum name is stripped and label is PascalCased (" + stripped +
          "), this value label conflicts with " + values[stripped]->name() +
          ". This will make the proto fail to compile for some languages, such "
          "as C#.";
      // There are proto2 enums out there with conflicting names, so to preserve
      // compatibility we issue only a warning for proto2.
      if (result->file()->syntax() == FileDescriptor::SYNTAX_PROTO2) {
        AddWarning(value->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NAME, error_message);
      } else {
        AddError(value->full_name(), proto.value(i),
                 DescriptorPool::ErrorCollector::NAME, error_message);
      }
    }
  }
}